

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O1

void __thiscall Test::expect<bool>(Test *this,bool *exp,bool *got,string *file,int line)

{
  ostream *poVar1;
  
  this->nr_tests = this->nr_tests + 1;
  if (*exp == *got) {
    this->nr_passed_tests = this->nr_passed_tests + 1;
    return;
  }
  if (this->verbose == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"TEST Error @",0xc);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(file->_M_dataplus)._M_p,file->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,":",1);
    std::ostream::operator<<(poVar1,line);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,", expected ",0xb);
    std::ostream::_M_insert<bool>(true);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,", got ",6);
    poVar1 = std::ostream::_M_insert<bool>(true);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    return;
  }
  return;
}

Assistant:

void expect(const T &exp, const T &got, const std::string &file, int line) {
    ++nr_tests;
    if (exp == got) {
      ++nr_passed_tests;
      return;
    }
    if (verbose) {
      std::cerr << "TEST Error @" << file << ":" << line;
      std::cerr << ", expected " << exp;
      std::cerr << ", got " << got << std::endl;
    }
  }